

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TablePrinter * Catch::operator<<(undefined8 tp)

{
  int iVar1;
  undefined8 uVar2;
  string *psVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  ostream *poVar7;
  int __oflag;
  string *__file;
  allocator<char> local_c1;
  string local_c0 [8];
  string padding;
  value_type colInfo;
  allocator<char> local_61;
  string local_60 [32];
  ulong local_40;
  size_type strSize;
  __string_type colStr;
  TablePrinter *tp_local;
  
  colStr.field_2._8_8_ = tp;
  std::__cxx11::ostringstream::str();
  local_40 = std::__cxx11::string::size();
  psVar3 = (string *)(colStr.field_2._8_8_ + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_61);
  __file = local_60;
  std::__cxx11::ostringstream::str(psVar3);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  TablePrinter::open((TablePrinter *)colStr.field_2._8_8_,(char *)__file,__oflag);
  iVar1 = *(int *)(colStr.field_2._8_8_ + 0x198);
  sVar4 = clara::std::
          vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          ::size((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                  *)(colStr.field_2._8_8_ + 8));
  if (iVar1 == (int)sVar4 + -1) {
    *(undefined4 *)(colStr.field_2._8_8_ + 0x198) = 0xffffffff;
    std::operator<<(*(ostream **)colStr.field_2._8_8_,'\n');
  }
  *(int *)(colStr.field_2._8_8_ + 0x198) = *(int *)(colStr.field_2._8_8_ + 0x198) + 1;
  pvVar5 = clara::std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::operator[]((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                         *)(colStr.field_2._8_8_ + 8),(long)*(int *)(colStr.field_2._8_8_ + 0x198));
  anon_unknown_2::ColumnInfo::ColumnInfo((ColumnInfo *)((long)&padding.field_2 + 8),pvVar5);
  if (local_40 + 1 < (ulong)(long)(int)colInfo.name.field_2._8_4_) {
    uVar6 = ~local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,uVar6 + (long)(int)colInfo.name.field_2._8_4_,' ',&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  else {
    std::__cxx11::string::string(local_c0);
  }
  if (colInfo.name.field_2._12_4_ == 0) {
    poVar7 = std::operator<<(*(ostream **)colStr.field_2._8_8_,(string *)&strSize);
    poVar7 = std::operator<<(poVar7,local_c0);
    std::operator<<(poVar7,' ');
  }
  else {
    poVar7 = std::operator<<(*(ostream **)colStr.field_2._8_8_,local_c0);
    poVar7 = std::operator<<(poVar7,(string *)&strSize);
    std::operator<<(poVar7,' ');
  }
  uVar2 = colStr.field_2._8_8_;
  std::__cxx11::string::~string(local_c0);
  anon_unknown_2::ColumnInfo::~ColumnInfo((ColumnInfo *)((long)&padding.field_2 + 8));
  std::__cxx11::string::~string((string *)&strSize);
  return (TablePrinter *)uVar2;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        const auto strSize = colStr.size();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << '\n';
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 1 < static_cast<std::size_t>(colInfo.width))
            ? std::string(colInfo.width - (strSize + 1), ' ')
            : std::string();
        if (colInfo.justification == ColumnInfo::Left)
            tp.m_os << colStr << padding << ' ';
        else
            tp.m_os << padding << colStr << ' ';
        return tp;
    }